

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::FilterCase::iterate(FilterCase *this)

{
  pointer pMVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  uint uVar5;
  undefined4 extraout_var;
  NotSupportedError *this_00;
  string *desc;
  value_type *__value;
  uchar *tbs;
  size_t tbslen;
  MessageFilter baseFilter;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  refMessages;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  filters;
  undefined1 local_108 [32];
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_e8;
  undefined1 local_c8 [32];
  long local_a8;
  undefined1 local_a0;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_98;
  vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
  local_80;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_68;
  vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
  local_48;
  long lVar6;
  
  bVar2 = isKHRDebugSupported((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context);
  if (bVar2) {
    iVar3 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    lVar6 = CONCAT44(extraout_var,iVar3);
    (**(code **)(lVar6 + 0x5e0))(0x92e0);
    (**(code **)(lVar6 + 0x5e0))(0x8242);
    (**(code **)(lVar6 + 0x420))(BaseCase::callbackHandle,this);
    tbslen = 1;
    (**(code **)(lVar6 + 0x428))(0x1100,0x1100,0x1100,0,0);
    local_c8._0_8_ = local_c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Reference run","");
    desc = (string *)local_c8;
    genMessages(&local_98,this,true,desc);
    if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
      operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
    }
    local_108._0_8_ = (pointer)0x0;
    local_108._8_8_ = (pointer)0x0;
    local_108._16_8_ = (pointer)0x0;
    local_c8._0_8_ = (pointer)0x110000001100;
    local_c8._8_4_ = 0x1100;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_c8 + 0x10),
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
    local_a0 = 1;
    if ((pointer)local_108._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
    }
    dVar4 = deStringHash((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                         super_TestNode.m_name._M_dataplus._M_p);
    uVar5 = tcu::CommandLine::getBaseSeed
                      (((this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx)->m_cmdLine);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
              *)local_108,(size_type)local_c8,__value,(allocator_type *)desc);
    tbs = (uchar *)(ulong)(uVar5 ^ dVar4);
    genFilters(&local_80,
               (FilterCase *)
               (this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
               m_name._M_dataplus._M_p,&local_98,
               (vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
                *)local_108,uVar5 ^ dVar4,(int)tbslen);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector((vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
               *)local_108);
    local_e8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    applyFilters(this,&local_80);
    pMVar1 = (pointer)(local_108 + 0x10);
    local_108._0_8_ = pMVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"Filtered run","");
    genMessages(&local_68,this,false,(string *)local_108);
    local_e8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_68.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_e8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_68.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_e8.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_68.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_48.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&local_48);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&local_68);
    if ((pointer)local_108._0_8_ != pMVar1) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
    }
    verify(this,(EVP_PKEY_CTX *)&local_98,(uchar *)&local_e8,(size_t)&local_80,tbs,tbslen);
    uVar5 = (*((this->super_BaseCase).super_ErrorCase.super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[2])();
    if (((uVar5 >> 0xb & 1) == 0) &&
       (local_98.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_98.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_108._0_8_ = pMVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_108,"Verification accuracy is lacking without a debug context","");
      tcu::ResultCollector::addResult
                (&(this->super_BaseCase).m_results,QP_TEST_RESULT_QUALITY_WARNING,
                 (string *)local_108);
      if ((pointer)local_108._0_8_ != pMVar1) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&local_e8);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::FilterCase::MessageFilter>_>
    ::~vector(&local_80);
    if ((void *)local_c8._16_8_ != (void *)0x0) {
      operator_delete((void *)local_c8._16_8_,local_a8 - local_c8._16_8_);
    }
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::MessageData,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::MessageData>_>
    ::~vector(&local_98);
    (**(code **)(lVar6 + 0x4e8))(0x92e0);
    (**(code **)(lVar6 + 0x420))(0,0);
    tcu::ResultCollector::setTestContextResult
              (&(this->super_BaseCase).m_results,
               (this->super_BaseCase).super_ErrorCase.super_TestCase.super_TestCase.super_TestNode.
               m_testCtx);
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
             ,0x3a6);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

FilterCase::IterateResult FilterCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.enable(GL_DEBUG_OUTPUT);
	gl.enable(GL_DEBUG_OUTPUT_SYNCHRONOUS);
	gl.debugMessageCallback(callbackHandle, this);

	try
	{
		gl.debugMessageControl(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, 0, DE_NULL, true);

		{
			const vector<MessageData>	refMessages		= genMessages(true, "Reference run");
			const MessageFilter			baseFilter		(GL_DONT_CARE, GL_DONT_CARE, GL_DONT_CARE, vector<GLuint>(), true);
			const deUint32				baseSeed		= deStringHash(getName()) ^ m_testCtx.getCommandLine().getBaseSeed();
			const vector<MessageFilter>	filters			= genFilters(refMessages, vector<MessageFilter>(1, baseFilter), baseSeed, 4);
			vector<MessageData>			filteredMessages;

			applyFilters(filters);

			// Generate errors
			filteredMessages = genMessages(false, "Filtered run");

			// Verify
			verify(refMessages, filteredMessages, filters);

			if (!isDebugContext() && refMessages.empty())
				m_results.addResult(QP_TEST_RESULT_QUALITY_WARNING, "Verification accuracy is lacking without a debug context");
		}
	}
	catch (...)
	{
		gl.disable(GL_DEBUG_OUTPUT);
		gl.debugMessageCallback(DE_NULL, DE_NULL);
		throw;
	}

	gl.disable(GL_DEBUG_OUTPUT);
	gl.debugMessageCallback(DE_NULL, DE_NULL);
	m_results.setTestContextResult(m_testCtx);

	return STOP;
}